

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::OwnFd> * __thiscall
kj::ArrayBuilder<kj::OwnFd>::operator=(ArrayBuilder<kj::OwnFd> *this,ArrayBuilder<kj::OwnFd> *other)

{
  ArrayBuilder<kj::OwnFd> *other_local;
  ArrayBuilder<kj::OwnFd> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (OwnFd *)0x0;
  other->pos = (RemoveConst<kj::OwnFd> *)0x0;
  other->endPtr = (OwnFd *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }